

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fadop.h
# Opt level: O1

value_type * __thiscall
FadBinaryMul<Fad<Fad<double>_>,_FadCst<int>_>::dx
          (value_type *__return_storage_ptr__,FadBinaryMul<Fad<Fad<double>_>,_FadCst<int>_> *this,
          int i)

{
  int iVar1;
  Fad<Fad<double>_> *pFVar2;
  double *pdVar3;
  long lVar4;
  long lVar5;
  Fad<double> *pFVar6;
  double dVar7;
  
  pFVar2 = this->left_;
  pFVar6 = &pFVar2->defaultVal;
  if ((pFVar2->dx_).num_elts != 0) {
    pFVar6 = (pFVar2->dx_).ptr_to_data + i;
  }
  dVar7 = (double)(this->right_).constant_;
  __return_storage_ptr__->val_ = pFVar6->val_ * dVar7;
  iVar1 = (pFVar6->dx_).num_elts;
  (__return_storage_ptr__->dx_).num_elts = 0;
  (__return_storage_ptr__->dx_).ptr_to_data = (double *)0x0;
  if (0 < (long)iVar1) {
    (__return_storage_ptr__->dx_).num_elts = iVar1;
    pdVar3 = (double *)operator_new__((long)iVar1 << 3);
    (__return_storage_ptr__->dx_).ptr_to_data = pdVar3;
  }
  __return_storage_ptr__->defaultVal = 0.0;
  lVar4 = (long)(pFVar6->dx_).num_elts;
  if (0 < lVar4) {
    pdVar3 = (__return_storage_ptr__->dx_).ptr_to_data;
    lVar5 = 0;
    do {
      pdVar3[lVar5] = (pFVar6->dx_).ptr_to_data[lVar5] * dVar7;
      lVar5 = lVar5 + 1;
    } while (lVar4 != lVar5);
  }
  return __return_storage_ptr__;
}

Assistant:

const value_type dx(int i) const {return  left_.dx(i) * right_.val();}